

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ArgParams * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseParams
          (ArgParams *__return_storage_ptr__,Parser *this,string *element_kind,bool *got_comma,
          Fodder *close_fodder)

{
  pointer pAVar1;
  AST *pAVar2;
  StaticError *this_00;
  pointer this_01;
  allocator<char> local_109;
  string local_108;
  Token paren_r;
  
  (__return_storage_ptr__->
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parseArgs(&paren_r,this,__return_storage_ptr__,element_kind,got_comma);
  this_01 = (__return_storage_ptr__->
            super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (__return_storage_ptr__->
           super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_01 == pAVar1) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(close_fodder,&paren_r.fodder);
      Token::~Token(&paren_r);
      return __return_storage_ptr__;
    }
    if (this_01->id == (Identifier *)0x0) {
      pAVar2 = this_01->expr;
      if (pAVar2->type != AST_VAR) {
        this_00 = (StaticError *)__cxa_allocate_exception(0x60);
        pAVar2 = this_01->expr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"could not parse parameter here.",&local_109);
        StaticError::StaticError(this_00,&pAVar2->location,&local_108);
        __cxa_throw(this_00,&StaticError::typeinfo,StaticError::~StaticError);
      }
      this_01->id = (Identifier *)pAVar2[1]._vptr_AST;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&this_01->idFodder,&pAVar2->openFodder);
      this_01->expr = (AST *)0x0;
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

ArgParams parseParams(const std::string &element_kind, bool &got_comma, Fodder &close_fodder)
    {
        ArgParams params;
        Token paren_r = parseArgs(params, element_kind, got_comma);

        // Check they're all identifiers
        // parseArgs returns f(x) with x as an expression.  Convert it here.
        for (auto &p : params) {
            if (p.id == nullptr) {
                if (p.expr->type != AST_VAR) {
                    throw StaticError(p.expr->location, "could not parse parameter here.");
                }
                auto *pv = static_cast<Var *>(p.expr);
                p.id = pv->id;
                p.idFodder = pv->openFodder;
                p.expr = nullptr;
            }
        }

        close_fodder = paren_r.fodder;

        return params;
    }